

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O1

Gia_Man_t * Gia_ManExtractWin(Gia_Man_t *p,Vec_Int_t *vOuts,int fPoOnly)

{
  int iVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *__dest;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  Vec_Int_t *vAnds;
  Vec_Int_t *vPos;
  Vec_Int_t *vPis;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  Gia_ManPrepareWin(p,vOuts,&local_38,&local_40,&local_48,fPoOnly);
  p_00 = Gia_ManStart(local_48->nSize + local_38->nSize + local_40->nSize + 1);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(__s);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pObjs->Value = 0;
  if (0 < local_38->nSize) {
    lVar13 = 0;
    do {
      iVar1 = local_38->pArray[lVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0065726c;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_0065724d;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_0065724d;
      pGVar2[iVar1].Value = (int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_38->nSize);
  }
  if (0 < local_48->nSize) {
    lVar13 = 0;
    do {
      iVar1 = local_48->pArray[lVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0065726c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar1;
      uVar8 = *(ulong *)pGVar2;
      uVar4 = pGVar2[-(ulong)((uint)uVar8 & 0x1fffffff)].Value;
      if ((int)uVar4 < 0) {
LAB_0065728b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar3 = (uint)(uVar8 >> 0x20);
      uVar16 = pGVar2[-(ulong)(uVar3 & 0x1fffffff)].Value;
      if ((int)uVar16 < 0) goto LAB_0065728b;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar11 = uVar4 >> 1;
      iVar1 = p_00->nObjs;
      if (iVar1 <= (int)uVar11) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x267,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar9 = uVar16 >> 1;
      if (iVar1 <= (int)uVar9) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x268,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if (uVar11 == uVar9) {
        __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x269,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar4 = (uint)(uVar8 >> 0x1d) & 1 ^ uVar4;
      uVar16 = uVar16 ^ uVar3 >> 0x1d & 1;
      iVar14 = (int)pGVar7;
      if ((int)uVar4 < (int)uVar16) {
        pGVar6 = p_00->pObjs;
        if ((pGVar7 < pGVar6) || (pGVar6 + iVar1 <= pGVar7)) goto LAB_0065724d;
        uVar8 = *(ulong *)pGVar7;
        uVar10 = (ulong)((uVar4 & 1) << 0x1d |
                        ((uint)(iVar14 - (int)pGVar6) >> 2) * -0x55555555 - uVar11 & 0x1fffffff);
        *(ulong *)pGVar7 = uVar10 | uVar8 & 0xffffffffc0000000;
        pGVar6 = p_00->pObjs;
        if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0065724d;
        uVar12 = (ulong)(((uint)(iVar14 - (int)pGVar6) >> 2) * -0x55555555 - uVar9 & 0x1fffffff) <<
                 0x20;
        *(ulong *)pGVar7 = uVar10 | uVar8 & 0xe0000000c0000000 | uVar12;
        uVar17 = (ulong)(uVar16 & 1) << 0x3d;
        uVar12 = uVar10 | uVar8 & 0xc0000000c0000000 | uVar12;
      }
      else {
        pGVar6 = p_00->pObjs;
        if ((pGVar7 < pGVar6) || (pGVar6 + iVar1 <= pGVar7)) {
LAB_0065724d:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar15 = (ulong)(((uint)(iVar14 - (int)pGVar6) >> 2) * -0x55555555 - uVar11 & 0x1fffffff) <<
                 0x20;
        uVar8 = *(ulong *)pGVar7;
        uVar10 = (ulong)(uVar4 & 1) << 0x3d;
        *(ulong *)pGVar7 = uVar10 | uVar8 & 0xc0000000ffffffff | uVar15;
        pGVar6 = p_00->pObjs;
        if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0065724d;
        uVar12 = (ulong)(((uint)(iVar14 - (int)pGVar6) >> 2) * -0x55555555 - uVar9 & 0x1fffffff);
        *(ulong *)pGVar7 = uVar10 | uVar8 & 0xc0000000e0000000 | uVar15 | uVar12;
        uVar17 = (ulong)((uVar16 & 1) << 0x1d);
        uVar12 = uVar10 | uVar8 & 0xc0000000c0000000 | uVar15 | uVar12;
      }
      *(ulong *)pGVar7 = uVar12 | uVar17;
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar7 + -(uVar12 & 0x1fffffff),pGVar7);
        Gia_ObjAddFanout(p_00,pGVar7 + -((ulong)*(uint *)&pGVar7->field_0x4 & 0x1fffffff),pGVar7);
      }
      if (p_00->fSweeper != 0) {
        uVar10 = *(ulong *)pGVar7 & 0x1fffffff;
        uVar8 = *(ulong *)pGVar7 >> 0x20 & 0x1fffffff;
        uVar15 = 0x4000000000000000;
        if (((uint)*(ulong *)(pGVar7 + -uVar10) >> 0x1e & 1) == 0) {
          uVar15 = 0x40000000;
        }
        *(ulong *)(pGVar7 + -uVar10) = uVar15 | *(ulong *)(pGVar7 + -uVar10);
        uVar15 = *(ulong *)(pGVar7 + -uVar8);
        uVar12 = 0x4000000000000000;
        if (((uint)uVar15 >> 0x1e & 1) == 0) {
          uVar12 = 0x40000000;
        }
        *(ulong *)(pGVar7 + -uVar8) = uVar12 | uVar15;
        uVar8 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 =
             uVar8 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar8 >> 0x3d) ^ (uint)(uVar15 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pGVar7 + -uVar10) >> 0x3f) ^
                    (uint)(uVar8 >> 0x1d) & 7)) << 0x3f;
      }
      pGVar6 = p_00->pObjs;
      if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0065724d;
      pGVar2->Value = (int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_48->nSize);
  }
  if (0 < local_40->nSize) {
    lVar13 = 0;
    do {
      iVar1 = local_40->pArray[lVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0065726c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManAppendCo(p_00,p->pObjs[iVar1].Value);
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_40->nSize);
  }
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
    local_38->pArray = (int *)0x0;
  }
  if (local_38 != (Vec_Int_t *)0x0) {
    free(local_38);
  }
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
    local_40->pArray = (int *)0x0;
  }
  if (local_40 != (Vec_Int_t *)0x0) {
    free(local_40);
  }
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
    local_48->pArray = (int *)0x0;
  }
  if (local_48 != (Vec_Int_t *)0x0) {
    free(local_48);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManExtractWin( Gia_Man_t * p, Vec_Int_t * vOuts, int fPoOnly )
{
    Vec_Int_t * vPis, * vPos, * vAnds;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManPrepareWin( p, vOuts, &vPis, &vPos, &vAnds, fPoOnly );
    // create AIG
    pNew = Gia_ManStart( Vec_IntSize(vPis) + Vec_IntSize(vPos) + Vec_IntSize(vAnds) + 1 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObjVec( vPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachObjVec( vPos, p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vAnds );
    return pNew;
}